

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O0

char * guess_plot_filext(char *filepath,char *filext)

{
  size_t sVar1;
  char *local_28;
  int local_1c;
  char *pcStack_18;
  int32_t i;
  char *filext_local;
  char *filepath_local;
  
  pcStack_18 = filext;
  if (filext == (char *)0x0) {
    sVar1 = strlen(filepath);
    local_1c = (int)sVar1;
    do {
      local_1c = local_1c + -1;
      if (((local_1c < 0) || (filepath[local_1c] == '/')) || (filepath[local_1c] == '\\'))
      goto LAB_00107db8;
    } while (filepath[local_1c] != '.');
    pcStack_18 = filepath + (long)local_1c + 1;
  }
LAB_00107db8:
  if (pcStack_18 == (char *)0x0) {
    local_28 = "pdf";
  }
  else {
    local_28 = pcStack_18;
  }
  return local_28;
}

Assistant:

const char *guess_plot_filext(const char *filepath, const char *filext) {
    if (filext == NULL) {
        for (int32_t i = strlen(filepath) - 1; i >= 0; i--) {
            if (filepath[i] == '/' || filepath[i] == '\\') {
                break;
            } else if (filepath[i] == '.') {
                filext = filepath + i + 1;
                break;
            }
        }
    }

    // Default the file extension to pdf if none is specified and if we cannot
    // autodetect
    filext = filext != NULL ? filext : "pdf";
    return filext;
}